

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio.c
# Opt level: O1

void audio_callback(void *userdata,Uint8 *stream,int length)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  float *out;
  long lVar4;
  
  if (3 < (uint)length) {
    uVar1 = *(ulong *)((long)userdata + 0x4078);
    lVar4 = 0;
    uVar2 = *(ulong *)((long)userdata + 0x4070);
    do {
      uVar3 = uVar2;
      if (uVar2 < uVar1) {
        uVar3 = uVar2 + 1;
        *(ulong *)((long)userdata + 0x4070) = uVar3;
        *(undefined4 *)((long)userdata + 0x408c) =
             *(undefined4 *)((long)userdata + (ulong)((uint)uVar2 & 0xfff) * 4 + 0x70);
      }
      *(undefined4 *)(stream + lVar4 * 4) = *(undefined4 *)((long)userdata + 0x408c);
      lVar4 = lVar4 + 1;
      uVar2 = uVar3;
    } while (((ulong)(long)length >> 2) + (ulong)((ulong)(long)length >> 2 == 0) != lVar4);
  }
  return;
}

Assistant:

void audio_callback(void* userdata, Uint8* stream, int length) {
    gba_apu_t* apu = (gba_apu_t*)userdata;
    float* out = (float*)stream;
    for (int i = 0; i < length / sizeof(float); i++) {
        if (apu->bigbuffer.read_index < apu->bigbuffer.write_index) {
            apu->apu_last_sample = apu->bigbuffer.buf[(apu->bigbuffer.read_index++) % AUDIO_BIGBUFFER_SIZE];
        }
        *out++ = apu->apu_last_sample;
    }
}